

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O0

Matrix4x4 * CMU462::Matrix4x4::rotation(Matrix4x4 *__return_storage_ptr__,double theta,Axis axis)

{
  double *pdVar1;
  double dVar2;
  Axis axis_local;
  double theta_local;
  Matrix4x4 *B;
  
  Matrix4x4(__return_storage_ptr__);
  if (axis == X) {
    pdVar1 = operator()(__return_storage_ptr__,0,0);
    *pdVar1 = 1.0;
    pdVar1 = operator()(__return_storage_ptr__,0,1);
    *pdVar1 = 0.0;
    pdVar1 = operator()(__return_storage_ptr__,0,2);
    *pdVar1 = 0.0;
    pdVar1 = operator()(__return_storage_ptr__,0,3);
    *pdVar1 = 0.0;
    pdVar1 = operator()(__return_storage_ptr__,1,0);
    *pdVar1 = 0.0;
    dVar2 = cos(theta);
    pdVar1 = operator()(__return_storage_ptr__,1,1);
    *pdVar1 = dVar2;
    dVar2 = sin(theta);
    pdVar1 = operator()(__return_storage_ptr__,1,2);
    *pdVar1 = -dVar2;
    pdVar1 = operator()(__return_storage_ptr__,1,3);
    *pdVar1 = 0.0;
    pdVar1 = operator()(__return_storage_ptr__,2,0);
    *pdVar1 = 0.0;
    dVar2 = sin(theta);
    pdVar1 = operator()(__return_storage_ptr__,2,1);
    *pdVar1 = dVar2;
    dVar2 = cos(theta);
    pdVar1 = operator()(__return_storage_ptr__,2,2);
    *pdVar1 = dVar2;
    pdVar1 = operator()(__return_storage_ptr__,2,3);
    *pdVar1 = 0.0;
    pdVar1 = operator()(__return_storage_ptr__,3,0);
    *pdVar1 = 0.0;
    pdVar1 = operator()(__return_storage_ptr__,3,1);
    *pdVar1 = 0.0;
    pdVar1 = operator()(__return_storage_ptr__,3,2);
    *pdVar1 = 0.0;
    pdVar1 = operator()(__return_storage_ptr__,3,3);
    *pdVar1 = 1.0;
  }
  else if (axis == Y) {
    dVar2 = cos(theta);
    pdVar1 = operator()(__return_storage_ptr__,0,0);
    *pdVar1 = dVar2;
    pdVar1 = operator()(__return_storage_ptr__,0,1);
    *pdVar1 = 0.0;
    dVar2 = sin(theta);
    pdVar1 = operator()(__return_storage_ptr__,0,2);
    *pdVar1 = dVar2;
    pdVar1 = operator()(__return_storage_ptr__,0,3);
    *pdVar1 = 0.0;
    pdVar1 = operator()(__return_storage_ptr__,1,0);
    *pdVar1 = 0.0;
    pdVar1 = operator()(__return_storage_ptr__,1,1);
    *pdVar1 = 1.0;
    pdVar1 = operator()(__return_storage_ptr__,1,2);
    *pdVar1 = 0.0;
    pdVar1 = operator()(__return_storage_ptr__,1,3);
    *pdVar1 = 0.0;
    dVar2 = sin(theta);
    pdVar1 = operator()(__return_storage_ptr__,2,0);
    *pdVar1 = -dVar2;
    pdVar1 = operator()(__return_storage_ptr__,2,1);
    *pdVar1 = 0.0;
    dVar2 = cos(theta);
    pdVar1 = operator()(__return_storage_ptr__,2,2);
    *pdVar1 = dVar2;
    pdVar1 = operator()(__return_storage_ptr__,2,3);
    *pdVar1 = 0.0;
    pdVar1 = operator()(__return_storage_ptr__,3,0);
    *pdVar1 = 0.0;
    pdVar1 = operator()(__return_storage_ptr__,3,1);
    *pdVar1 = 0.0;
    pdVar1 = operator()(__return_storage_ptr__,3,2);
    *pdVar1 = 0.0;
    pdVar1 = operator()(__return_storage_ptr__,3,3);
    *pdVar1 = 1.0;
  }
  else if (axis == Z) {
    dVar2 = cos(theta);
    pdVar1 = operator()(__return_storage_ptr__,0,0);
    *pdVar1 = dVar2;
    dVar2 = sin(theta);
    pdVar1 = operator()(__return_storage_ptr__,0,1);
    *pdVar1 = -dVar2;
    pdVar1 = operator()(__return_storage_ptr__,0,2);
    *pdVar1 = 0.0;
    pdVar1 = operator()(__return_storage_ptr__,0,3);
    *pdVar1 = 0.0;
    dVar2 = sin(theta);
    pdVar1 = operator()(__return_storage_ptr__,1,0);
    *pdVar1 = dVar2;
    dVar2 = cos(theta);
    pdVar1 = operator()(__return_storage_ptr__,1,1);
    *pdVar1 = dVar2;
    pdVar1 = operator()(__return_storage_ptr__,1,2);
    *pdVar1 = 0.0;
    pdVar1 = operator()(__return_storage_ptr__,1,3);
    *pdVar1 = 0.0;
    pdVar1 = operator()(__return_storage_ptr__,2,0);
    *pdVar1 = 0.0;
    pdVar1 = operator()(__return_storage_ptr__,2,1);
    *pdVar1 = 0.0;
    pdVar1 = operator()(__return_storage_ptr__,2,2);
    *pdVar1 = 1.0;
    pdVar1 = operator()(__return_storage_ptr__,2,3);
    *pdVar1 = 0.0;
    pdVar1 = operator()(__return_storage_ptr__,3,0);
    *pdVar1 = 0.0;
    pdVar1 = operator()(__return_storage_ptr__,3,1);
    *pdVar1 = 0.0;
    pdVar1 = operator()(__return_storage_ptr__,3,2);
    *pdVar1 = 0.0;
    pdVar1 = operator()(__return_storage_ptr__,3,3);
    *pdVar1 = 1.0;
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix4x4 Matrix4x4::rotation(double theta, Axis axis) {
    Matrix4x4 B;

    switch (axis)
    {
    case Axis::X:
      B(0, 0) = 1.; B(0, 1) = 0.;         B(0, 2) = 0.;           B(0, 3) = 0.;
      B(1, 0) = 0.; B(1, 1) = cos(theta); B(1, 2) = -sin(theta);  B(1, 3) = 0.;
      B(2, 0) = 0.; B(2, 1) = sin(theta); B(2, 2) = cos(theta);   B(2, 3) = 0.;
      B(3, 0) = 0.; B(3, 1) = 0.;          B(3, 2) = 0.;          B(3, 3) = 1.;
      break;
    case Axis::Y:
      B(0, 0) = cos(theta);   B(0, 1) = 0.; B(0, 2) = sin(theta); B(0, 3) = 0.;
      B(1, 0) = 0.;           B(1, 1) = 1.; B(1, 2) = 0.;         B(1, 3) = 0.;
      B(2, 0) = -sin(theta);  B(2, 1) = 0.; B(2, 2) = cos(theta); B(2, 3) = 0.;
      B(3, 0) = 0.;           B(3, 1) = 0.; B(3, 2) = 0.;         B(3, 3) = 1.;
      break;
    case Axis::Z:
      B(0, 0) = cos(theta); B(0, 1) = -sin(theta);  B(0, 2) = 0.; B(0, 3) = 0.;
      B(1, 0) = sin(theta); B(1, 1) = cos(theta);   B(1, 2) = 0.; B(1, 3) = 0.;
      B(2, 0) = 0.;         B(2, 1) = 0.;           B(2, 2) = 1.; B(2, 3) = 0.;
      B(3, 0) = 0.;         B(3, 1) = 0.;           B(3, 2) = 0.; B(3, 3) = 1.;
      break;
    default:
      break;
    }

    return B;
  }